

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
__thiscall duckdb::ZSTDStorage::SerializeState(ZSTDStorage *this,ColumnSegment *segment)

{
  SerializedStringSegmentState *this_00;
  vector<long,_std::allocator<long>_> *__x;
  vector<long,_std::allocator<long>_> local_30;
  
  local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)(segment->segment_state).
                  super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
                  .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_30);
  if (((CompressedSegmentState *)
      (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start + 0xb))->_vptr_CompressedSegmentState ==
      ((CompressedSegmentState *)
      (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start + 0xc))->_vptr_CompressedSegmentState) {
    this_00 = (SerializedStringSegmentState *)0x0;
  }
  else {
    __x = (vector<long,_std::allocator<long>_> *)
          (local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start + 0xb);
    this_00 = (SerializedStringSegmentState *)operator_new(0x20);
    ::std::vector<long,_std::allocator<long>_>::vector(&local_30,__x);
    SerializedStringSegmentState::SerializedStringSegmentState
              (this_00,(vector<long,_true> *)&local_30);
    if ((CompressedSegmentState *)
        local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (CompressedSegmentState *)0x0) {
      operator_delete(local_30.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  *(SerializedStringSegmentState **)this = this_00;
  return (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         this;
}

Assistant:

unique_ptr<ColumnSegmentState> ZSTDStorage::SerializeState(ColumnSegment &segment) {
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	if (state.on_disk_blocks.empty()) {
		// no on-disk blocks - nothing to write
		return nullptr;
	}
	return make_uniq<SerializedStringSegmentState>(state.on_disk_blocks);
}